

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

uint32_t __thiscall
diligent_spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_minimum_scalar_alignment
          (PhysicalStorageBufferPointerHandler *this,SPIRType *type)

{
  size_t sVar1;
  TypedID<(diligent_spirv_cross::Types)1> *pTVar2;
  uint32_t uVar3;
  SPIRType *type_00;
  uint uVar4;
  long lVar5;
  
  uVar4 = 8;
  if (type->storage != PhysicalStorageBuffer) {
    if (type->basetype == Struct) {
      sVar1 = (type->member_types).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
              buffer_size;
      if (sVar1 == 0) {
        uVar4 = 0;
      }
      else {
        pTVar2 = (type->member_types).
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
                 ptr;
        lVar5 = 0;
        uVar4 = 0;
        do {
          type_00 = Variant::get<diligent_spirv_cross::SPIRType>
                              ((this->compiler->ir).ids.
                               super_VectorView<diligent_spirv_cross::Variant>.ptr +
                               *(uint *)((long)&pTVar2->id + lVar5));
          uVar3 = get_minimum_scalar_alignment(this,type_00);
          if (uVar4 < uVar3) {
            uVar4 = uVar3;
          }
          lVar5 = lVar5 + 4;
        } while (sVar1 << 2 != lVar5);
      }
    }
    else {
      uVar4 = type->width >> 3;
    }
  }
  return uVar4;
}

Assistant:

uint32_t Compiler::PhysicalStorageBufferPointerHandler::get_minimum_scalar_alignment(const SPIRType &type) const
{
	if (type.storage == spv::StorageClassPhysicalStorageBufferEXT)
		return 8;
	else if (type.basetype == SPIRType::Struct)
	{
		uint32_t alignment = 0;
		for (auto &member_type : type.member_types)
		{
			uint32_t member_align = get_minimum_scalar_alignment(compiler.get<SPIRType>(member_type));
			if (member_align > alignment)
				alignment = member_align;
		}
		return alignment;
	}
	else
		return type.width / 8;
}